

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DefaultRowEst(Index *pIdx)

{
  short *psVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  
  psVar1 = pIdx->aiRowLogEst;
  uVar4 = 5;
  if (pIdx->nKeyCol < 5) {
    uVar4 = (uint)pIdx->nKeyCol;
  }
  sVar2 = (short)*(undefined4 *)&pIdx->pTable->nRowLogEst;
  sVar3 = 0x21;
  if (0x21 < sVar2) {
    sVar3 = sVar2;
  }
  *psVar1 = sVar3;
  memcpy(psVar1 + 1,&DAT_0017d74e,(ulong)(uVar4 * 2 & 0xffff));
  for (uVar5 = (ulong)uVar4; uVar5 < pIdx->nKeyCol; uVar5 = uVar5 + 1) {
    (psVar1 + 1)[uVar5] = 0x17;
  }
  if (pIdx->onError != '\0') {
    psVar1[pIdx->nKeyCol] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
  /*                10,  9,  8,  7,  6 */
  LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Set the first entry (number of rows in the index) to the estimated 
  ** number of rows in the table. Or 10, if the estimated number of rows 
  ** in the table is less than that.  */
  a[0] = pIdx->pTable->nRowLogEst;
  if( a[0]<33 ) a[0] = 33;        assert( 33==sqlite3LogEst(10) );

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}